

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O1

void Gla_ManStop(Gla_Man_t *p)

{
  sat_solver2 *psVar1;
  void *__ptr;
  int *piVar2;
  long lVar3;
  Gla_Obj_t *pGVar4;
  long lVar5;
  
  if (p->pPars->fVerbose != 0) {
    psVar1 = p->pSat;
    Abc_Print(psVar1->nDBreduces,
              "SAT solver:  Var = %d  Cla = %d  Conf = %d  Lrn = %d  Reduce = %d  Cex = %d  Objs+ = %d\n"
              ,(ulong)(uint)psVar1->size,(ulong)(psVar1->stats).clauses,
              (ulong)(uint)(psVar1->stats).conflicts,(ulong)(psVar1->stats).learnts,
              (ulong)(uint)psVar1->nDBreduces,(ulong)(uint)p->nCexes,(ulong)(uint)p->nObjAdded);
  }
  Rnm_ManStop(p->pRnm,0);
  if ((p->pvRefis != (Vec_Int_t *)0x0) && (0 < p->pGia->nObjs)) {
    lVar3 = 8;
    lVar5 = 0;
    do {
      __ptr = *(void **)((long)&p->pvRefis->nCap + lVar3);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&p->pvRefis->nCap + lVar3) = 0;
      }
      lVar5 = lVar5 + 1;
      lVar3 = lVar3 + 0x10;
    } while (lVar5 < p->pGia->nObjs);
  }
  if (1 < p->nObjs) {
    pGVar4 = p->pObjs + 1;
    do {
      piVar2 = (pGVar4->vFrames).pArray;
      if (piVar2 != (int *)0x0) {
        free(piVar2);
        (pGVar4->vFrames).pArray = (int *)0x0;
      }
      pGVar4 = pGVar4 + 1;
    } while (pGVar4 < p->pObjs + p->nObjs);
  }
  Cnf_DataFree(p->pCnf);
  if (p->pGia0 != (Gia_Man_t *)0x0) {
    Gia_ManStop(p->pGia);
  }
  sat_solver2_delete(p->pSat);
  if (p->vObjCounts != (Vec_Int_t *)0x0) {
    piVar2 = p->vObjCounts->pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
      p->vObjCounts->pArray = (int *)0x0;
    }
    if (p->vObjCounts != (Vec_Int_t *)0x0) {
      free(p->vObjCounts);
      p->vObjCounts = (Vec_Int_t *)0x0;
    }
  }
  if (p->vAddedNew != (Vec_Int_t *)0x0) {
    piVar2 = p->vAddedNew->pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
      p->vAddedNew->pArray = (int *)0x0;
    }
    if (p->vAddedNew != (Vec_Int_t *)0x0) {
      free(p->vAddedNew);
      p->vAddedNew = (Vec_Int_t *)0x0;
    }
  }
  if (p->vCoreCounts != (Vec_Int_t *)0x0) {
    piVar2 = p->vCoreCounts->pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
      p->vCoreCounts->pArray = (int *)0x0;
    }
    if (p->vCoreCounts != (Vec_Int_t *)0x0) {
      free(p->vCoreCounts);
      p->vCoreCounts = (Vec_Int_t *)0x0;
    }
  }
  if (p->vProofIds != (Vec_Int_t *)0x0) {
    piVar2 = p->vProofIds->pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
      p->vProofIds->pArray = (int *)0x0;
    }
    if (p->vProofIds != (Vec_Int_t *)0x0) {
      free(p->vProofIds);
      p->vProofIds = (Vec_Int_t *)0x0;
    }
  }
  if (p->vTemp != (Vec_Int_t *)0x0) {
    piVar2 = p->vTemp->pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
      p->vTemp->pArray = (int *)0x0;
    }
    if (p->vTemp != (Vec_Int_t *)0x0) {
      free(p->vTemp);
      p->vTemp = (Vec_Int_t *)0x0;
    }
  }
  if (p->vAbs != (Vec_Int_t *)0x0) {
    piVar2 = p->vAbs->pArray;
    if (piVar2 != (int *)0x0) {
      free(piVar2);
      p->vAbs->pArray = (int *)0x0;
    }
    if (p->vAbs != (Vec_Int_t *)0x0) {
      free(p->vAbs);
      p->vAbs = (Vec_Int_t *)0x0;
    }
  }
  if (p->pvRefis != (Vec_Int_t *)0x0) {
    free(p->pvRefis);
    p->pvRefis = (Vec_Int_t *)0x0;
  }
  if (p->pObj2Obj != (uint *)0x0) {
    free(p->pObj2Obj);
    p->pObj2Obj = (uint *)0x0;
  }
  if (p->pObjs != (Gla_Obj_t *)0x0) {
    free(p->pObjs);
    p->pObjs = (Gla_Obj_t *)0x0;
  }
  free(p);
  return;
}

Assistant:

void Gla_ManStop( Gla_Man_t * p )
{
    Gla_Obj_t * pGla;
    int i;

    if ( p->pPars->fVerbose )
        Abc_Print( 1, "SAT solver:  Var = %d  Cla = %d  Conf = %d  Lrn = %d  Reduce = %d  Cex = %d  Objs+ = %d\n", 
            sat_solver2_nvars(p->pSat), sat_solver2_nclauses(p->pSat), sat_solver2_nconflicts(p->pSat), 
            sat_solver2_nlearnts(p->pSat), p->pSat->nDBreduces, p->nCexes, p->nObjAdded );

    // stop the refinement manager
//    Gia_ManStopP( &p->pGia2 );
    Rnm_ManStop( p->pRnm, 0 );

    if ( p->pvRefis )
    for ( i = 0; i < Gia_ManObjNum(p->pGia); i++ )
        ABC_FREE( p->pvRefis[i].pArray );
    Gla_ManForEachObj( p, pGla )
        ABC_FREE( pGla->vFrames.pArray );
    Cnf_DataFree( p->pCnf );
    if ( p->pGia0 != NULL )
        Gia_ManStop( p->pGia );
//    Gia_ManStaticFanoutStart( p->pGia0 );
    sat_solver2_delete( p->pSat );
    Vec_IntFreeP( &p->vObjCounts );
    Vec_IntFreeP( &p->vAddedNew );
    Vec_IntFreeP( &p->vCoreCounts );
    Vec_IntFreeP( &p->vProofIds );
    Vec_IntFreeP( &p->vTemp );
    Vec_IntFreeP( &p->vAbs );
    ABC_FREE( p->pvRefis );
    ABC_FREE( p->pObj2Obj );
    ABC_FREE( p->pObjs );
    ABC_FREE( p );
}